

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_MultipleSubcomMatchingWithCaseFirst_Test::TApp_MultipleSubcomMatchingWithCaseFirst_Test
          (TApp_MultipleSubcomMatchingWithCaseFirst_Test *this)

{
  TApp_MultipleSubcomMatchingWithCaseFirst_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_MultipleSubcomMatchingWithCaseFirst_Test_001bf8e8;
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCaseFirst) {
    app.ignore_case();
    app.add_subcommand("first");
    EXPECT_THROW(app.add_subcommand("fIrst"), CLI::OptionAlreadyAdded);
}